

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O2

TestCaseGroup * vkt::geometry::createInputGeometryShaderTests(TestContext *testCtx)

{
  int iVar1;
  TestCaseGroup *node;
  TestCaseGroup *pTVar2;
  GeometryExpanderRenderTest *pGVar3;
  long lVar4;
  int local_b4;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> conversionPrimitiveGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> triStripAdjacencyGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> basicPrimitiveGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> inputPrimitiveGroup;
  PrimitiveTestSpec primitives;
  string name;
  
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,"input","Different input primitives.");
  inputPrimitiveGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar2;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,testCtx,"basic_primitive","Basic Primitive geometry tests");
  basicPrimitiveGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar2;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,testCtx,"triangle_strip_adjacency",
             "Different triangle_strip_adjacency vertex counts.");
  triStripAdjacencyGroup.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar2;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,testCtx,"conversion","Different input and output primitives.");
  conversionPrimitiveGroup.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar2;
  for (lVar4 = 0;
      pTVar2 = basicPrimitiveGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar4 != 0xd8; lVar4 = lVar4 + 0x18) {
    pGVar3 = (GeometryExpanderRenderTest *)operator_new(0x78);
    anon_unknown_2::GeometryExpanderRenderTest::GeometryExpanderRenderTest
              (pGVar3,testCtx,(PrimitiveTestSpec *)(&DAT_00bf5180 + lVar4));
    tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pGVar3);
  }
  for (local_b4 = 0; local_b4 < 0xd; local_b4 = local_b4 + 1) {
    de::toString<int>((string *)&primitives,&local_b4);
    std::operator+(&name,"vertex_count_",(string *)&primitives);
    std::__cxx11::string::~string((string *)&primitives);
    pTVar2 = triStripAdjacencyGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    primitives.primitiveType = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY;
    primitives.name = name._M_dataplus._M_p;
    primitives.outputType = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    pGVar3 = (GeometryExpanderRenderTest *)operator_new(0x80);
    iVar1 = local_b4;
    anon_unknown_2::GeometryExpanderRenderTest::GeometryExpanderRenderTest
              (pGVar3,testCtx,&primitives);
    (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_00bf53b8;
    *(int *)&pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar1;
    tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pGVar3);
    std::__cxx11::string::~string((string *)&name);
  }
  for (lVar4 = 0;
      node = basicPrimitiveGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr,
      pTVar2 = conversionPrimitiveGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar4 != 0x90; lVar4 = lVar4 + 0x18) {
    pGVar3 = (GeometryExpanderRenderTest *)operator_new(0x78);
    anon_unknown_2::GeometryExpanderRenderTest::GeometryExpanderRenderTest
              (pGVar3,testCtx,
               (PrimitiveTestSpec *)
               ((long)&createInputGeometryShaderTests::conversionPrimitives[0].primitiveType + lVar4
               ));
    tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pGVar3);
  }
  basicPrimitiveGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(inputPrimitiveGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&node->super_TestNode);
  pTVar2 = triStripAdjacencyGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  triStripAdjacencyGroup.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(inputPrimitiveGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar2->super_TestNode);
  pTVar2 = conversionPrimitiveGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  conversionPrimitiveGroup.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(inputPrimitiveGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar2->super_TestNode);
  pTVar2 = inputPrimitiveGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  inputPrimitiveGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&conversionPrimitiveGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&triStripAdjacencyGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&basicPrimitiveGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&inputPrimitiveGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar2;
}

Assistant:

TestCaseGroup* createInputGeometryShaderTests (TestContext& testCtx)
{
	MovePtr<TestCaseGroup> inputPrimitiveGroup		(new TestCaseGroup(testCtx, "input", "Different input primitives."));
	MovePtr<TestCaseGroup> basicPrimitiveGroup		(new TestCaseGroup(testCtx, "basic_primitive", "Basic Primitive geometry tests"));
	MovePtr<TestCaseGroup> triStripAdjacencyGroup	(new TestCaseGroup(testCtx, "triangle_strip_adjacency",	"Different triangle_strip_adjacency vertex counts."));
	MovePtr<TestCaseGroup> conversionPrimitiveGroup	(new TestCaseGroup(testCtx, "conversion", "Different input and output primitives."));

	const PrimitiveTestSpec inputPrimitives[] =
	{
		{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,						"points",					VK_PRIMITIVE_TOPOLOGY_POINT_LIST		},
		{ VK_PRIMITIVE_TOPOLOGY_LINE_LIST,						"lines",					VK_PRIMITIVE_TOPOLOGY_LINE_STRIP		},
		{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,						"line_strip",				VK_PRIMITIVE_TOPOLOGY_LINE_STRIP		},
		{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,					"triangles",				VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP	},
		{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,					"triangle_strip",			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP	},
		{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,					"triangle_fan",				VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP	},
		{ VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY,		"lines_adjacency",			VK_PRIMITIVE_TOPOLOGY_LINE_STRIP		},
		{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY,		"line_strip_adjacency",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP		},
		{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY,	"triangles_adjacency",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP	}
	};

		// more basic types
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(inputPrimitives); ++ndx)
			basicPrimitiveGroup->addChild(new GeometryExpanderRenderTest(testCtx, inputPrimitives[ndx]));

		// triangle strip adjacency with different vertex counts
		for (int vertexCount = 0; vertexCount <= 12; ++vertexCount)
		{
			const string name = "vertex_count_" + de::toString(vertexCount);
			const PrimitiveTestSpec primitives = { VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY, name.c_str(), VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP };

			triStripAdjacencyGroup->addChild(new TriangleStripAdjacencyVertexCountTest(testCtx, primitives, vertexCount));
		}

		// different type conversions
		{
			static const PrimitiveTestSpec conversionPrimitives[] =
			{
				{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	"triangles_to_points",	VK_PRIMITIVE_TOPOLOGY_POINT_LIST	},
				{ VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		"lines_to_points",		VK_PRIMITIVE_TOPOLOGY_POINT_LIST	},
				{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		"points_to_lines",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP	},
				{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	"triangles_to_lines",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP	},
				{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		"points_to_triangles",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP},
				{ VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		"lines_to_triangles",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP}
			};

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(conversionPrimitives); ++ndx)
				conversionPrimitiveGroup->addChild(new GeometryExpanderRenderTest(testCtx, conversionPrimitives[ndx]));
		}

	inputPrimitiveGroup->addChild(basicPrimitiveGroup.release());
	inputPrimitiveGroup->addChild(triStripAdjacencyGroup.release());
	inputPrimitiveGroup->addChild(conversionPrimitiveGroup.release());
	return inputPrimitiveGroup.release();
}